

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::doubling::
     updategroup<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator ISA,iterator SA,iterator first,iterator last)

{
  long lVar1;
  int iVar2;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar3;
  ulong uVar4;
  BitmapArray<long> *pBVar5;
  BitmapArray<long> *pBVar6;
  ulong uVar7;
  long lVar8;
  
  uVar4 = first.pos_;
  pBVar6 = first.array_;
  pBVar5 = ISA.array_;
  if (uVar4 < last.pos_) {
    do {
      (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar4);
      uVar3 = uVar4;
      if (-1 < extraout_var) {
        lVar1 = -1;
        do {
          lVar8 = lVar1;
          iVar2 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar3);
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar5,CONCAT44(extraout_var_00,iVar2) + ISA.pos_,-SA.pos_ + uVar3);
          uVar3 = uVar3 + 1;
          if (last.pos_ <= uVar3) {
            (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])(pBVar6,uVar4,lVar8);
            return;
          }
          (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar3);
          lVar1 = lVar8 + -1;
        } while (-1 < extraout_var_01);
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])(pBVar6,uVar4,lVar8);
        uVar4 = uVar3;
        if (last.pos_ <= uVar3) {
          return;
        }
      }
      do {
        uVar7 = uVar3;
        iVar2 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar7);
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[4])(pBVar6,uVar7,~CONCAT44(extraout_var_02,iVar2));
        uVar3 = uVar7 + 1;
        (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar3);
      } while (extraout_var_03 < 0);
      do {
        iVar2 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,uVar4);
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])
                  (pBVar5,CONCAT44(extraout_var_04,iVar2) + ISA.pos_,-SA.pos_ + uVar3);
        uVar4 = uVar4 + 1;
      } while (uVar4 <= uVar3);
      uVar4 = uVar7 + 2;
    } while (uVar4 < last.pos_);
  }
  return;
}

Assistant:

void updategroup(ISAIterator_type ISA, const SAIterator_type SA,
                 SAIterator_type first, SAIterator_type last) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  SAIterator_type a, b;
  value_type t;

  for (a = first; a < last; ++a) {
    if (0 <= *a) {
      b = a;
      do {
        ISA[*a] = a - SA;
      } while ((++a < last) && (0 <= *a));
      *b = b - a;
      if (last <= a) {
        break;
      }
    }
    b = a;
    do {
      *a = ~*a;
    } while (*++a < 0);
    t = a - SA;
    do {
      ISA[*b] = t;
    } while (++b <= a);
  }
}